

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::register_call_out_argument(CompilerGLSL *this,uint32_t id)

{
  SPIRVariable *pSVar1;
  
  Compiler::register_write(&this->super_Compiler,id);
  pSVar1 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  if (pSVar1 != (SPIRVariable *)0x0) {
    flush_variable_declaration(this,(pSVar1->super_IVariant).self.id);
    return;
  }
  return;
}

Assistant:

void CompilerGLSL::register_call_out_argument(uint32_t id)
{
	register_write(id);

	auto *var = maybe_get<SPIRVariable>(id);
	if (var)
		flush_variable_declaration(var->self);
}